

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readam.c
# Opt level: O3

DUH * dumb_read_riff_am(DUMBFILE *f,riff *stream)

{
  uint uVar1;
  riff_chunk *prVar2;
  riff *prVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  bool bVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  int32 iVar10;
  DUMB_IT_SIGDATA *sigdata_00;
  IT_PATTERN *pIVar11;
  IT_SAMPLE *pIVar12;
  uchar *puVar13;
  riff *prVar14;
  DUH *pDVar15;
  char cVar16;
  uchar uVar17;
  uchar uVar18;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  long lVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  DUH_SIGTYPE_DESC *descptr;
  sigdata_t *sigdata;
  char *tag [2] [2];
  uint local_7c;
  DUH_SIGTYPE_DESC *local_68;
  DUMB_IT_SIGDATA *local_60;
  char *local_58;
  DUMB_IT_SIGDATA *local_50;
  char *local_48;
  char *local_40;
  
  local_68 = &_dumb_sigtype_it;
  if (((stream != (riff *)0x0 && f != (DUMBFILE *)0x0) && (stream->type == 0x414d2020)) &&
     (sigdata_00 = (DUMB_IT_SIGDATA *)malloc(0x138), sigdata_00 != (DUMB_IT_SIGDATA *)0x0)) {
    sigdata_00->n_samples = 0;
    sigdata_00->n_patterns = 0;
    sigdata_00->name[0] = '\0';
    if (stream->chunk_count != 0) {
      uVar21 = 0;
      local_7c = 0;
      do {
        prVar2 = stream->chunks + uVar21;
        uVar8 = prVar2->type;
        if ((int)uVar8 < 0x50415454) {
          if (uVar8 == 0x494e4954) {
            if (((local_7c & 1) != 0) || (prVar2->size < 0x48)) goto LAB_005adf3c;
            local_7c = local_7c | 1;
          }
          else if (uVar8 == 0x4f524452) {
            if (((local_7c & 2) != 0) || (prVar2->size == 0)) goto LAB_005adf3c;
            local_7c = local_7c | 2;
          }
        }
        else if (uVar8 == 0x50415454) {
          iVar7 = dumbfile_seek(f,(long)prVar2->offset,0);
          if (iVar7 != 0) goto LAB_005adf3c;
          iVar7 = dumbfile_getc(f);
          if (sigdata_00->n_patterns <= iVar7) {
            sigdata_00->n_patterns = iVar7 + 1;
          }
          iVar10 = dumbfile_igetl(f);
          if (prVar2->size < iVar10 + 5U) goto LAB_005adf3c;
        }
        else if (((uVar8 == 0x52494646) && (prVar3 = prVar2->nested, prVar3->type == 0x41492020)) &&
                (prVar3->chunk_count != 0)) {
          uVar20 = 0;
          do {
            prVar2 = prVar3->chunks;
            if (prVar2[uVar20].type == 0x494e5354) {
              iVar7 = dumbfile_seek(f,(long)prVar2[uVar20].offset,0);
              if ((iVar7 != 0) || (uVar8 = dumbfile_igetl(f), uVar8 < 0x142)) goto LAB_005adf3c;
              dumbfile_skip(f,1);
              iVar7 = dumbfile_getc(f);
              if (sigdata_00->n_samples <= iVar7) {
                sigdata_00->n_samples = iVar7 + 1;
              }
              prVar14 = riff_parse(f,uVar8 + prVar2[uVar20].offset + 4,
                                   (prVar2[uVar20].size - uVar8) + -4,1);
              if (prVar14 != (riff *)0x0) {
                if ((prVar14->type == 0x41532020) && ((ulong)prVar14->chunk_count != 0)) {
                  lVar22 = 0;
                  bVar4 = false;
                  do {
                    bVar6 = bVar4;
                    if ((*(int *)((long)&prVar14->chunks->type + lVar22) == 0x53414d50) &&
                       (bVar6 = true, bVar4)) {
                      riff_free(prVar14);
                      goto LAB_005adf3c;
                    }
                    bVar4 = bVar6;
                    lVar22 = lVar22 + 0x18;
                  } while ((ulong)prVar14->chunk_count * 0x18 != lVar22);
                }
                riff_free(prVar14);
              }
            }
            uVar20 = uVar20 + 1;
          } while (uVar20 < prVar3->chunk_count);
        }
        uVar21 = uVar21 + 1;
        uVar8 = stream->chunk_count;
      } while (uVar21 < uVar8);
      if ((((local_7c == 3) && (sigdata_00->n_samples != 0)) &&
          (uVar1 = sigdata_00->n_patterns, (int)uVar1 < 0x100)) &&
         ((sigdata_00->n_samples < 0x100 && (uVar1 != 0)))) {
        sigdata_00->song_message = (uchar *)0x0;
        sigdata_00->n_orders = 0;
        sigdata_00->n_instruments = 0;
        sigdata_00->order = (uchar *)0x0;
        sigdata_00->instrument = (IT_INSTRUMENT *)0x0;
        sigdata_00->sample = (IT_SAMPLE *)0x0;
        sigdata_00->pattern = (IT_PATTERN *)0x0;
        sigdata_00->midi = (IT_MIDI *)0x0;
        sigdata_00->checkpoint = (IT_CHECKPOINT *)0x0;
        sigdata_00->mixing_volume = 0x30;
        sigdata_00->pan_separation = 0x80;
        sigdata_00->restart_position = '\0';
        builtin_memcpy(sigdata_00->channel_volume,
                       "@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@",0x40);
        cVar16 = (char)(uint)((ulong)((long)(dumb_it_default_panning_separation << 5) * 0x51eb851f)
                             >> 0x25) - (char)((dumb_it_default_panning_separation << 5) >> 0x1f);
        uVar18 = ' ' - cVar16;
        uVar17 = cVar16 + ' ';
        uVar21 = 0xfffffffffffffffc;
        do {
          sigdata_00->channel_pan[uVar21 + 4] = uVar18;
          sigdata_00->channel_pan[uVar21 + 5] = uVar17;
          sigdata_00->channel_pan[uVar21 + 6] = uVar17;
          sigdata_00->channel_pan[uVar21 + 7] = uVar18;
          uVar21 = uVar21 + 4;
        } while (uVar21 < 0x3c);
        if (uVar8 == 0) {
          uVar8 = 0;
        }
        else {
          uVar21 = 0;
          do {
            prVar2 = stream->chunks;
            if (prVar2[uVar21].type == 0x494e4954) {
              iVar7 = dumbfile_seek(f,(long)prVar2[uVar21].offset,0);
              if (iVar7 != 0) goto LAB_005ae328;
              dumbfile_getnc((char *)sigdata_00,0x40,f);
              sigdata_00->name[0x40] = '\0';
              sigdata_00->flags = 0x131;
              uVar8 = dumbfile_getc(f);
              if ((uVar8 & 1) == 0) {
                *(byte *)&sigdata_00->flags = (byte)sigdata_00->flags | 8;
              }
              if ((uVar8 & 0xfffffffe) != 2) goto LAB_005ae328;
              iVar7 = dumbfile_getc(f);
              sigdata_00->n_pchannels = iVar7;
              iVar7 = dumbfile_getc(f);
              sigdata_00->speed = iVar7;
              iVar7 = dumbfile_getc(f);
              sigdata_00->tempo = iVar7;
              dumbfile_skip(f,4);
              iVar7 = dumbfile_getc(f);
              sigdata_00->global_volume = iVar7;
              if (prVar2[uVar21].size < sigdata_00->n_pchannels + 0x48U) goto LAB_005ae328;
              if (0 < sigdata_00->n_pchannels) {
                lVar22 = 0;
                do {
                  iVar7 = dumbfile_getc(f);
                  uVar17 = (uchar)((uint)(iVar7 - (iVar7 >> 0x1f)) >> 1);
                  puVar13 = sigdata_00->channel_pan;
                  if (0x80 < iVar7) {
                    puVar13 = sigdata_00->channel_volume;
                    uVar17 = '\0';
                  }
                  puVar13[lVar22] = uVar17;
                  lVar22 = lVar22 + 1;
                } while (lVar22 < sigdata_00->n_pchannels);
              }
            }
            uVar21 = uVar21 + 1;
            uVar8 = stream->chunk_count;
          } while (uVar21 < uVar8);
          uVar1 = sigdata_00->n_patterns;
        }
        pIVar11 = (IT_PATTERN *)malloc((long)(int)uVar1 << 4);
        sigdata_00->pattern = pIVar11;
        auVar5 = _DAT_005d6240;
        if (pIVar11 != (IT_PATTERN *)0x0) {
          if (0 < (int)uVar1) {
            lVar22 = (ulong)uVar1 - 1;
            auVar23._8_4_ = (int)lVar22;
            auVar23._0_8_ = lVar22;
            auVar23._12_4_ = (int)((ulong)lVar22 >> 0x20);
            lVar22 = 0;
            auVar23 = auVar23 ^ _DAT_005d6240;
            auVar24 = _DAT_005d6230;
            do {
              auVar25 = auVar24 ^ auVar5;
              if ((bool)(~(auVar25._4_4_ == auVar23._4_4_ && auVar23._0_4_ < auVar25._0_4_ ||
                          auVar23._4_4_ < auVar25._4_4_) & 1)) {
                *(undefined8 *)((long)&pIVar11->entry + lVar22) = 0;
              }
              if ((auVar25._12_4_ != auVar23._12_4_ || auVar25._8_4_ <= auVar23._8_4_) &&
                  auVar25._12_4_ <= auVar23._12_4_) {
                *(undefined8 *)((long)&pIVar11[1].entry + lVar22) = 0;
              }
              lVar19 = auVar24._8_8_;
              auVar24._0_8_ = auVar24._0_8_ + 2;
              auVar24._8_8_ = lVar19 + 2;
              lVar22 = lVar22 + 0x20;
            } while ((ulong)(uVar1 + 1 >> 1) << 5 != lVar22);
          }
          iVar7 = sigdata_00->n_samples;
          pIVar12 = (IT_SAMPLE *)malloc((long)iVar7 * 0x68);
          sigdata_00->sample = pIVar12;
          if (pIVar12 != (IT_SAMPLE *)0x0) {
            if (0 < iVar7) {
              lVar22 = 0;
              lVar19 = 0;
              do {
                pIVar12 = sigdata_00->sample;
                puVar13 = pIVar12->filename + lVar22 + 0x35;
                puVar13[0] = '\0';
                puVar13[1] = '\0';
                puVar13[2] = '\0';
                puVar13[3] = '\0';
                puVar13[4] = '\0';
                puVar13[5] = '\0';
                puVar13[6] = '\0';
                puVar13[7] = '\0';
                pIVar12->filename[lVar22 + 0xf] = '\0';
                pIVar12->name[lVar22] = '\0';
                lVar19 = lVar19 + 1;
                lVar22 = lVar22 + 0x68;
              } while (lVar19 < sigdata_00->n_samples);
              uVar8 = stream->chunk_count;
            }
            if (uVar8 != 0) {
              uVar21 = 0;
              do {
                prVar2 = stream->chunks + uVar21;
                uVar8 = prVar2->type;
                if (uVar8 == 0x52494646) {
                  prVar3 = prVar2->nested;
                  if ((prVar3->type == 0x41492020) && (uVar8 = prVar3->chunk_count, uVar8 != 0)) {
                    uVar20 = 0;
                    do {
                      prVar2 = prVar3->chunks;
                      if (prVar2[uVar20].type == 0x494e5354) {
                        iVar7 = dumbfile_seek(f,(long)prVar2[uVar20].offset,0);
                        if (iVar7 != 0) goto LAB_005ae328;
                        iVar10 = dumbfile_igetl(f);
                        dumbfile_skip(f,1);
                        iVar7 = dumbfile_getc(f);
                        prVar14 = riff_parse(f,iVar10 + prVar2[uVar20].offset + 4,
                                             (prVar2[uVar20].size - iVar10) + -4,1);
                        pIVar12 = sigdata_00->sample;
                        if (prVar14 != (riff *)0x0) {
                          if ((prVar14->type == 0x41532020) && ((ulong)prVar14->chunk_count != 0)) {
                            lVar22 = 0;
                            do {
                              if (*(int *)((long)&prVar14->chunks->type + lVar22) == 0x53414d50) {
                                riff_free(prVar14);
                                goto LAB_005ae328;
                              }
                              lVar22 = lVar22 + 0x18;
                            } while ((ulong)prVar14->chunk_count * 0x18 != lVar22);
                          }
                          riff_free(prVar14);
                        }
                        dumbfile_seek(f,(long)prVar2[uVar20].offset + 6,0);
                        dumbfile_getnc((char *)(pIVar12 + iVar7),0x20,f);
                        pIVar12[iVar7].name[0x20] = '\0';
                        uVar8 = prVar3->chunk_count;
                      }
                      uVar20 = uVar20 + 1;
                    } while (uVar20 < uVar8);
                  }
                }
                else if (uVar8 == 0x50415454) {
                  iVar7 = dumbfile_seek(f,(long)prVar2->offset,0);
                  if (iVar7 != 0) goto LAB_005ae328;
                  iVar7 = dumbfile_getc(f);
                  iVar10 = dumbfile_igetl(f);
                  iVar7 = it_riff_am_process_pattern(sigdata_00->pattern + iVar7,f,iVar10,1);
                  if (iVar7 != 0) goto LAB_005ae328;
                }
                else if (uVar8 == 0x4f524452) {
                  iVar7 = dumbfile_seek(f,(long)prVar2->offset,0);
                  if (iVar7 != 0) goto LAB_005ae328;
                  iVar9 = dumbfile_getc(f);
                  iVar7 = iVar9 + 1;
                  sigdata_00->n_orders = iVar7;
                  if (prVar2->size < iVar9 + 2U) goto LAB_005ae328;
                  puVar13 = (uchar *)malloc((long)iVar7);
                  sigdata_00->order = puVar13;
                  if (puVar13 == (uchar *)0x0) goto LAB_005ae328;
                  dumbfile_getnc((char *)puVar13,iVar7,f);
                }
                uVar21 = uVar21 + 1;
              } while (uVar21 < stream->chunk_count);
            }
            _dumb_it_fix_invalid_orders(sigdata_00);
            local_58 = "TITLE";
            local_48 = "FORMAT";
            local_40 = "RIFF AM";
            local_60 = sigdata_00;
            local_50 = sigdata_00;
            pDVar15 = make_duh(-1,2,(char *(*) [2])&local_58,1,&local_68,&local_60);
            return pDVar15;
          }
        }
LAB_005ae328:
        _dumb_it_unload_sigdata(sigdata_00);
        return (DUH *)0x0;
      }
    }
LAB_005adf3c:
    free(sigdata_00);
  }
  return (DUH *)0x0;
}

Assistant:

DUH *dumb_read_riff_am( DUMBFILE * f, struct riff * stream )
{
	sigdata_t *sigdata;

	DUH_SIGTYPE_DESC *descptr = &_dumb_sigtype_it;

    sigdata = it_riff_am_load_sigdata( f, stream );

	if (!sigdata)
		return NULL;

	{
		const char *tag[2][2];
		tag[0][0] = "TITLE";
        tag[0][1] = (const char *)(((DUMB_IT_SIGDATA *)sigdata)->name);
		tag[1][0] = "FORMAT";
		tag[1][1] = "RIFF AM";
		return make_duh( -1, 2, ( const char * const (*) [ 2 ] ) tag, 1, & descptr, & sigdata );
	}
}